

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O2

void google::protobuf::MapTestUtil::SetArenaMapFields<proto2_unittest::TestArenaMapLite>
               (TestArenaMapLite *message)

{
  MapFieldLite<long,_long> *this;
  MapFieldLite<unsigned_int,_unsigned_int> *this_00;
  int *piVar1;
  long *plVar2;
  uint *puVar3;
  unsigned_long *puVar4;
  float *pfVar5;
  double *pdVar6;
  bool *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  MapEnumLite *pMVar9;
  ForeignMessageArenaLite *pFVar10;
  MapFieldLite<int,_proto2_unittest::ForeignMessageArenaLite> *this_01;
  key_arg<unsigned_long> local_e0 [4];
  key_arg<std::__cxx11::basic_string<char>_> local_c0;
  MapFieldLite<int,_proto2_unittest::MapEnumLite> *local_a0;
  MapFieldLite<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  Map<std::__cxx11::string,std::__cxx11::string> *local_90;
  MapFieldLite<unsigned_int,_unsigned_int> *local_88;
  MapFieldLite<bool,_bool> *local_80;
  MapFieldLite<int,_double> *local_78;
  MapFieldLite<int,_float> *local_70;
  MapFieldLite<long,_long> *local_68;
  MapFieldLite<int,_int> *local_60;
  MapFieldLite<unsigned_long,_unsigned_long> *local_58;
  MapFieldLite<unsigned_int,_unsigned_int> *local_50;
  MapFieldLite<long,_long> *local_48;
  MapFieldLite<int,_int> *local_40;
  MapFieldLite<unsigned_long,_unsigned_long> *local_38;
  
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  piVar1 = Map<int,_int>::operator[]<int>
                     ((Map<int,_int> *)&(message->field_0)._impl_,(key_arg<int> *)local_e0);
  *piVar1 = 0;
  this = &(message->field_0)._impl_.map_int64_int64_;
  local_e0[0] = 0;
  plVar2 = Map<long,_long>::operator[]<long>((Map<long,_long> *)this,(key_arg<long> *)local_e0);
  *plVar2 = 0;
  this_00 = &(message->field_0)._impl_.map_uint32_uint32_;
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  puVar3 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>
                     ((Map<unsigned_int,_unsigned_int> *)this_00,(key_arg<unsigned_int> *)local_e0);
  *puVar3 = 0;
  local_38 = &(message->field_0)._impl_.map_uint64_uint64_;
  local_e0[0] = 0;
  puVar4 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>
                     ((Map<unsigned_long,_unsigned_long> *)local_38,local_e0);
  *puVar4 = 0;
  local_40 = &(message->field_0)._impl_.map_sint32_sint32_;
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  piVar1 = Map<int,_int>::operator[]<int>((Map<int,_int> *)local_40,(key_arg<int> *)local_e0);
  *piVar1 = 0;
  local_48 = &(message->field_0)._impl_.map_sint64_sint64_;
  local_e0[0] = 0;
  plVar2 = Map<long,_long>::operator[]<long>((Map<long,_long> *)local_48,(key_arg<long> *)local_e0);
  *plVar2 = 0;
  local_50 = &(message->field_0)._impl_.map_fixed32_fixed32_;
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  puVar3 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>
                     ((Map<unsigned_int,_unsigned_int> *)local_50,(key_arg<unsigned_int> *)local_e0)
  ;
  *puVar3 = 0;
  local_58 = &(message->field_0)._impl_.map_fixed64_fixed64_;
  local_e0[0] = 0;
  puVar4 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>
                     ((Map<unsigned_long,_unsigned_long> *)local_58,local_e0);
  *puVar4 = 0;
  local_60 = &(message->field_0)._impl_.map_sfixed32_sfixed32_;
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  piVar1 = Map<int,_int>::operator[]<int>((Map<int,_int> *)local_60,(key_arg<int> *)local_e0);
  *piVar1 = 0;
  local_68 = &(message->field_0)._impl_.map_sfixed64_sfixed64_;
  local_e0[0] = 0;
  plVar2 = Map<long,_long>::operator[]<long>((Map<long,_long> *)local_68,(key_arg<long> *)local_e0);
  *plVar2 = 0;
  local_70 = &(message->field_0)._impl_.map_int32_float_;
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  pfVar5 = Map<int,_float>::operator[]<int>((Map<int,_float> *)local_70,(key_arg<int> *)local_e0);
  *pfVar5 = 0.0;
  local_78 = &(message->field_0)._impl_.map_int32_double_;
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  pdVar6 = Map<int,_double>::operator[]<int>((Map<int,_double> *)local_78,(key_arg<int> *)local_e0);
  *pdVar6 = 0.0;
  local_80 = &(message->field_0)._impl_.map_bool_bool_;
  local_e0[0] = local_e0[0] & 0xffffffffffffff00;
  pbVar7 = Map<bool,_bool>::operator[]<bool>((Map<bool,_bool> *)local_80,(key_arg<bool> *)local_e0);
  *pbVar7 = false;
  long_string_abi_cxx11_();
  long_string_abi_cxx11_();
  local_90 = (Map<std::__cxx11::string,std::__cxx11::string> *)
             &(message->field_0)._impl_.map_string_string_;
  pbVar8 = Map<std::__cxx11::string,std::__cxx11::string>::operator[]<std::__cxx11::string,void>
                     (local_90,&local_c0);
  local_88 = this_00;
  std::__cxx11::string::operator=((string *)pbVar8,(string *)local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  long_string_abi_cxx11_();
  local_98 = &(message->field_0)._impl_.map_int32_bytes_;
  local_c0._M_dataplus._M_p._0_4_ = 0;
  pbVar8 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[]<int>((Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_98,(key_arg<int> *)&local_c0);
  std::__cxx11::string::operator=((string *)pbVar8,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  local_a0 = &(message->field_0)._impl_.map_int32_enum_;
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  pMVar9 = Map<int,_proto2_unittest::MapEnumLite>::operator[]<int>
                     ((Map<int,_proto2_unittest::MapEnumLite> *)local_a0,(key_arg<int> *)local_e0);
  *pMVar9 = MAP_ENUM_BAR_LITE;
  this_01 = &(message->field_0)._impl_.map_int32_foreign_message_;
  local_e0[0] = local_e0[0] & 0xffffffff00000000;
  pFVar10 = Map<int,_proto2_unittest::ForeignMessageArenaLite>::operator[]<int>
                      ((Map<int,_proto2_unittest::ForeignMessageArenaLite> *)this_01,
                       (key_arg<int> *)local_e0);
  (pFVar10->field_0)._impl_.c_ = 0;
  *(byte *)&pFVar10->field_0 = *(byte *)&pFVar10->field_0 | 1;
  local_e0[0] = CONCAT44(local_e0[0]._4_4_,1);
  piVar1 = Map<int,_int>::operator[]<int>
                     ((Map<int,_int> *)&(message->field_0)._impl_,(key_arg<int> *)local_e0);
  *piVar1 = 1;
  local_e0[0] = 1;
  plVar2 = Map<long,_long>::operator[]<long>((Map<long,_long> *)this,(key_arg<long> *)local_e0);
  *plVar2 = 1;
  local_e0[0] = CONCAT44(local_e0[0]._4_4_,1);
  puVar3 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>
                     ((Map<unsigned_int,_unsigned_int> *)local_88,(key_arg<unsigned_int> *)local_e0)
  ;
  *puVar3 = 1;
  local_e0[0] = 1;
  puVar4 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>
                     ((Map<unsigned_long,_unsigned_long> *)local_38,local_e0);
  *puVar4 = 1;
  local_e0[0] = CONCAT44(local_e0[0]._4_4_,1);
  piVar1 = Map<int,_int>::operator[]<int>((Map<int,_int> *)local_40,(key_arg<int> *)local_e0);
  *piVar1 = 1;
  local_e0[0] = 1;
  plVar2 = Map<long,_long>::operator[]<long>((Map<long,_long> *)local_48,(key_arg<long> *)local_e0);
  *plVar2 = 1;
  local_e0[0] = CONCAT44(local_e0[0]._4_4_,1);
  puVar3 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>
                     ((Map<unsigned_int,_unsigned_int> *)local_50,(key_arg<unsigned_int> *)local_e0)
  ;
  *puVar3 = 1;
  local_e0[0] = 1;
  puVar4 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>
                     ((Map<unsigned_long,_unsigned_long> *)local_58,local_e0);
  *puVar4 = 1;
  local_e0[0] = CONCAT44(local_e0[0]._4_4_,1);
  piVar1 = Map<int,_int>::operator[]<int>((Map<int,_int> *)local_60,(key_arg<int> *)local_e0);
  *piVar1 = 1;
  local_e0[0] = 1;
  plVar2 = Map<long,_long>::operator[]<long>((Map<long,_long> *)local_68,(key_arg<long> *)local_e0);
  *plVar2 = 1;
  local_e0[0]._0_4_ = 1;
  pfVar5 = Map<int,_float>::operator[]<int>((Map<int,_float> *)local_70,(key_arg<int> *)local_e0);
  *pfVar5 = 1.0;
  local_e0[0] = CONCAT44(local_e0[0]._4_4_,1);
  pdVar6 = Map<int,_double>::operator[]<int>((Map<int,_double> *)local_78,(key_arg<int> *)local_e0);
  *pdVar6 = 1.0;
  local_e0[0] = CONCAT71(local_e0[0]._1_7_,1);
  pbVar7 = Map<bool,_bool>::operator[]<bool>((Map<bool,_bool> *)local_80,(key_arg<bool> *)local_e0);
  *pbVar7 = true;
  long_string_2_abi_cxx11_();
  long_string_2_abi_cxx11_();
  pbVar8 = Map<std::__cxx11::string,std::__cxx11::string>::operator[]<std::__cxx11::string,void>
                     (local_90,&local_c0);
  std::__cxx11::string::operator=((string *)pbVar8,(string *)local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  long_string_2_abi_cxx11_();
  local_c0._M_dataplus._M_p._0_4_ = 1;
  pbVar8 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[]<int>((Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_98,(key_arg<int> *)&local_c0);
  std::__cxx11::string::operator=((string *)pbVar8,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  local_e0[0]._0_4_ = 1;
  pMVar9 = Map<int,_proto2_unittest::MapEnumLite>::operator[]<int>
                     ((Map<int,_proto2_unittest::MapEnumLite> *)local_a0,(key_arg<int> *)local_e0);
  *pMVar9 = MAP_ENUM_BAZ_LITE;
  local_e0[0] = CONCAT44(local_e0[0]._4_4_,1);
  pFVar10 = Map<int,_proto2_unittest::ForeignMessageArenaLite>::operator[]<int>
                      ((Map<int,_proto2_unittest::ForeignMessageArenaLite> *)this_01,
                       (key_arg<int> *)local_e0);
  (pFVar10->field_0)._impl_.c_ = 1;
  *(byte *)&pFVar10->field_0 = *(byte *)&pFVar10->field_0 | 1;
  return;
}

Assistant:

void MapTestUtil::SetArenaMapFields(TestArenaMap* message) {
  // Add first element.
  (*message->mutable_map_int32_int32())[0] = 0;
  (*message->mutable_map_int64_int64())[0] = 0;
  (*message->mutable_map_uint32_uint32())[0] = 0;
  (*message->mutable_map_uint64_uint64())[0] = 0;
  (*message->mutable_map_sint32_sint32())[0] = 0;
  (*message->mutable_map_sint64_sint64())[0] = 0;
  (*message->mutable_map_fixed32_fixed32())[0] = 0;
  (*message->mutable_map_fixed64_fixed64())[0] = 0;
  (*message->mutable_map_sfixed32_sfixed32())[0] = 0;
  (*message->mutable_map_sfixed64_sfixed64())[0] = 0;
  (*message->mutable_map_int32_float())[0] = 0.0;
  (*message->mutable_map_int32_double())[0] = 0.0;
  (*message->mutable_map_bool_bool())[0] = false;
  (*message->mutable_map_string_string())[long_string()] = long_string();
  (*message->mutable_map_int32_bytes())[0] = long_string();
  (*message->mutable_map_int32_enum())[0] = MapEnum_BAR<TestArenaMap>();
  (*message->mutable_map_int32_foreign_message())[0].set_c(0);

  // Add second element
  (*message->mutable_map_int32_int32())[1] = 1;
  (*message->mutable_map_int64_int64())[1] = 1;
  (*message->mutable_map_uint32_uint32())[1] = 1;
  (*message->mutable_map_uint64_uint64())[1] = 1;
  (*message->mutable_map_sint32_sint32())[1] = 1;
  (*message->mutable_map_sint64_sint64())[1] = 1;
  (*message->mutable_map_fixed32_fixed32())[1] = 1;
  (*message->mutable_map_fixed64_fixed64())[1] = 1;
  (*message->mutable_map_sfixed32_sfixed32())[1] = 1;
  (*message->mutable_map_sfixed64_sfixed64())[1] = 1;
  (*message->mutable_map_int32_float())[1] = 1.0;
  (*message->mutable_map_int32_double())[1] = 1.0;
  (*message->mutable_map_bool_bool())[1] = true;
  (*message->mutable_map_string_string())[long_string_2()] = long_string_2();
  (*message->mutable_map_int32_bytes())[1] = long_string_2();
  (*message->mutable_map_int32_enum())[1] = MapEnum_BAZ<TestArenaMap>();
  (*message->mutable_map_int32_foreign_message())[1].set_c(1);
}